

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry::
InodeFileConfig_MountPointMappingEntry
          (InodeFileConfig_MountPointMappingEntry *this,
          InodeFileConfig_MountPointMappingEntry *param_1)

{
  InodeFileConfig_MountPointMappingEntry *param_1_local;
  InodeFileConfig_MountPointMappingEntry *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__InodeFileConfig_MountPointMappingEntry_009c1340;
  ::std::__cxx11::string::string((string *)&this->mountpoint_,(string *)&param_1->mountpoint_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->scan_roots_,&param_1->scan_roots_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

InodeFileConfig_MountPointMappingEntry::InodeFileConfig_MountPointMappingEntry(InodeFileConfig_MountPointMappingEntry&&) noexcept = default;